

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

bool __thiscall llvm::consumeSignedInteger(llvm *this,StringRef *Str,uint Radix,longlong *Result)

{
  bool bVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  unsigned_long_long ULLVal;
  StringRef Str2;
  ulong local_30;
  unsigned_long_long *local_28;
  long lStack_20;
  
  if ((*(long *)(this + 8) == 0) || (Result = *(longlong **)this, (char)*Result != '-')) {
    bVar1 = consumeUnsignedInteger(this,Str,(uint)&local_30,(unsigned_long_long *)Result);
    bVar2 = true;
    if (-1 < (long)local_30 && !bVar1) {
      *(ulong *)CONCAT44(in_register_00000014,Radix) = local_30;
      bVar2 = false;
    }
  }
  else {
    local_28 = (unsigned_long_long *)((long)Result + 1);
    lStack_20 = *(long *)(this + 8) + -1;
    bVar1 = consumeUnsignedInteger((llvm *)&local_28,Str,(uint)&local_30,local_28);
    bVar2 = 0x8000000000000000 < local_30 || bVar1;
    if (0x8000000000000000 >= local_30 && !bVar1) {
      *(unsigned_long_long **)this = local_28;
      *(long *)(this + 8) = lStack_20;
      *(ulong *)CONCAT44(in_register_00000014,Radix) = -local_30;
    }
  }
  return bVar2;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}